

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask22_8(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1;
  uVar2 = in[1];
  *out = uVar2 << 0x16 | uVar1;
  uVar2 = uVar2 >> 10;
  out[1] = uVar2;
  uVar1 = in[2];
  out[1] = uVar1 << 0xc | uVar2;
  uVar1 = uVar1 >> 0x14;
  out[2] = uVar1;
  uVar1 = in[3] << 2 | uVar1;
  out[2] = uVar1;
  uVar2 = in[4];
  out[2] = uVar2 << 0x18 | uVar1;
  uVar2 = uVar2 >> 8;
  out[3] = uVar2;
  uVar1 = in[5];
  out[3] = uVar1 << 0xe | uVar2;
  uVar1 = uVar1 >> 0x12;
  out[4] = uVar1;
  uVar1 = in[6] << 4 | uVar1;
  out[4] = uVar1;
  uVar2 = in[7];
  out[4] = uVar2 << 0x1a | uVar1;
  out[5] = uVar2 >> 6;
  return out + 6;
}

Assistant:

uint32_t *__fastpackwithoutmask22_8(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 22;
  ++out;
  *out = ((*in)) >> (22 - 12);
  ++in;
  *out |= ((*in)) << 12;
  ++out;
  *out = ((*in)) >> (22 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 24;
  ++out;
  *out = ((*in)) >> (22 - 14);
  ++in;
  *out |= ((*in)) << 14;
  ++out;
  *out = ((*in)) >> (22 - 4);
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 26;
  ++out;
  *out = ((*in)) >> (22 - 16);
  ++in;

  return out + 1;
}